

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebra.cpp
# Opt level: O1

void __thiscall lsim::Transform::rotate(Transform *this,float degrees)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar6 = (degrees * 3.1415927) / 180.0;
  fVar7 = sinf(fVar6);
  fVar8 = cosf(fVar6);
  fVar6 = this->m_el[0][0];
  fVar1 = this->m_el[0][1];
  fVar2 = this->m_el[1][0];
  fVar3 = this->m_el[1][1];
  fVar4 = this->m_el[2][0];
  fVar5 = this->m_el[2][1];
  this->m_el[0][0] = fVar8 * fVar6 - fVar1 * fVar7;
  this->m_el[1][0] = fVar8 * fVar2 - fVar3 * fVar7;
  this->m_el[2][0] = fVar8 * fVar4 - fVar5 * fVar7;
  this->m_el[0][1] = fVar6 * fVar7 + fVar1 * fVar8;
  this->m_el[1][1] = fVar2 * fVar7 + fVar3 * fVar8;
  this->m_el[2][1] = fVar7 * fVar4 + fVar8 * fVar5;
  return;
}

Assistant:

void Transform::rotate(float degrees) {
	const float rad = deg2rad(degrees);
	const float sa = sinf(rad);
	const float ca = cosf(rad);
	const Transform cur(*this);

	m_el[0][0] = ca * cur.m_el[0][0] - sa * cur.m_el[0][1];
	m_el[1][0] = ca * cur.m_el[1][0] - sa * cur.m_el[1][1];
	m_el[2][0] = ca * cur.m_el[2][0] - sa * cur.m_el[2][1];

	m_el[0][1] = sa * cur.m_el[0][0] + ca * cur.m_el[0][1];
	m_el[1][1] = sa * cur.m_el[1][0] + ca * cur.m_el[1][1];
	m_el[2][1] = sa * cur.m_el[2][0] + ca * cur.m_el[2][1];
}